

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dh_ameth.c
# Opt level: O0

int dh_priv_decode(EVP_PKEY *pkey,PKCS8_PRIV_KEY_INFO *p8)

{
  DH *key;
  EVP_PKEY *in_RDI;
  DH *dh;
  int ret;
  char *in_stack_00000028;
  OSSL_LIB_CTX *in_stack_00000030;
  PKCS8_PRIV_KEY_INFO *in_stack_00000038;
  uint local_14;
  
  key = ossl_dh_key_from_pkcs8(in_stack_00000038,in_stack_00000030,in_stack_00000028);
  if (key != (DH *)0x0) {
    EVP_PKEY_assign(in_RDI,**(int **)&in_RDI->references,key);
  }
  local_14 = (uint)(key != (DH *)0x0);
  return local_14;
}

Assistant:

static int dh_priv_decode(EVP_PKEY *pkey, const PKCS8_PRIV_KEY_INFO *p8)
{
    int ret = 0;
    DH *dh = ossl_dh_key_from_pkcs8(p8, NULL, NULL);

    if (dh != NULL) {
        ret = 1;
        EVP_PKEY_assign(pkey, pkey->ameth->pkey_id, dh);
    }

    return ret;
}